

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult __thiscall
testing::internal::FloatingPointLE<double>
          (internal *this,char *expr1,char *expr2,double val1,double val2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar3;
  stringstream local_3c0 [8];
  stringstream val1_ss;
  long local_3b0;
  undefined8 auStack_3a8 [13];
  ios_base aiStack_340 [264];
  stringstream local_238 [8];
  stringstream val2_ss;
  long local_228;
  undefined8 auStack_220 [13];
  ios_base aiStack_1b8 [264];
  FloatingPointUnion local_b0;
  FloatingPoint<double> lhs;
  FloatingPoint<double> rhs;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string local_90;
  string local_70;
  char *local_50;
  char *expr1_local;
  char *expr2_local;
  double local_38;
  
  if (val2 <= val1) {
    local_b0.value_ = val1;
    lhs.u_ = (FloatingPointUnion)val2;
    local_50 = expr1;
    expr1_local = expr2;
    expr2_local = (char *)val1;
    local_38 = val2;
    bVar1 = FloatingPoint<double>::AlmostEquals((FloatingPoint<double> *)&local_b0,&lhs);
    expr2 = (char *)extraout_RDX;
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_3c0);
      *(undefined8 *)((long)auStack_3a8 + *(long *)(local_3b0 + -0x18)) = 0x11;
      std::ostream::_M_insert<double>((double)expr2_local);
      std::__cxx11::stringstream::stringstream(local_238);
      *(undefined8 *)((long)auStack_220 + *(long *)(local_228 + -0x18)) = 0x11;
      std::ostream::_M_insert<double>(local_38);
      rhs.u_.bits_._0_1_ = 0;
      local_98.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<((AssertionResult *)&rhs,(char (*) [12])"Expected: (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_50);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") <= (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&expr1_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x13db59);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x13d44e);
      StringStreamToString(&local_90,(stringstream *)local_3c0);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_90);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
      StringStreamToString(&local_70,(stringstream *)local_238);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_70);
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      std::__cxx11::stringstream::~stringstream(local_238);
      std::ios_base::~ios_base(aiStack_1b8);
      std::__cxx11::stringstream::~stringstream(local_3c0);
      std::ios_base::~ios_base(aiStack_340);
      expr2 = (char *)extraout_RDX_00;
      goto LAB_00133c9b;
    }
  }
  *this = (internal)0x1;
  *(undefined8 *)(this + 8) = 0;
LAB_00133c9b:
  AVar3.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr2;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}